

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall bpwriter::format_roman(bpwriter *this,vm_val_t *val,fmtopts *opts,int flags)

{
  char ch;
  int32_t iVar1;
  size_t len;
  int *piVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  char buf [40];
  int iVar2;
  
  iVar1 = vm_val_t::cast_to_int(val);
  if (0x1386 < iVar1 - 1U) {
    t3sprintf(buf,0x28,"%ld");
    len = strlen(buf);
    format_int(this,buf,len,(char *)0x0,opts,0);
    return;
  }
  uVar6 = 0;
  do {
    piVar3 = &format_roman::r[uVar6].val;
    while( true ) {
      if (iVar1 == 0) {
        return;
      }
      if (0xb < uVar6) {
        return;
      }
      iVar4 = iVar1 - *piVar3;
      if (*piVar3 <= iVar1) break;
      uVar6 = uVar6 + 1;
      piVar3 = piVar3 + 4;
    }
    pcVar5 = ((anon_struct_16_2_3239912c *)(piVar3 + -2))->numeral;
    while( true ) {
      ch = *pcVar5;
      iVar1 = iVar4;
      if (ch == '\0') break;
      if ((flags & 2U) != 0) {
        iVar2 = toupper((int)ch);
        ch = (char)iVar2;
      }
      putch(this,ch);
      pcVar5 = pcVar5 + 1;
    }
  } while( true );
}

Assistant:

void format_roman(VMG_ const vm_val_t *val, const fmtopts &opts, int flags)
    {
        char buf[40];

        /* get the integer value */
        int32_t i = val->cast_to_int(vmg0_);

        /* 
         *   use Roman numerals if it's in the range 1-4999, otherwise just
         *   treat it like '%d' 
         */
        if (i >= 1 && i <= 4999)
        {
            /* Roman numeral conversion chart */
            static const struct
            {
                const char *numeral;
                int val;
            } r[] =
            {
                { "m", 1000 },
                { "cm", 900 },
                { "d", 500 },
                { "cd", 400 },
                { "c", 100 },
                { "xc", 90 },
                { "l", 50 },
                { "x", 10 },
                { "ix", 9 },
                { "v", 5 },
                { "iv", 4 },
                { "i", 1 }
            };

            /* 
             *   convert by repeatedly appending the highest-value Roman
             *   numeral less than or equal to the number, deducting each
             *   Roman numeral value from the remaining number balance until
             *   we reach zero
             */
            for (size_t ri = 0 ; i != 0 && ri < countof(r) ; )
            {
                /* if this one fits, append this Roman numeral */
                if (r[ri].val <= i)
                {
                    /* append this numeral, converting case if needed */
                    for (const char *p = r[ri].numeral ; *p != 0 ; ++p)
                    {
                        if ((flags & FI_CAPS) != 0)
                            putch((char)toupper(*p));
                        else
                            putch(*p);
                    }
                    
                    /* deduct its value from the remaining balance */
                    i -= r[ri].val;
                }
                else
                {
                    /* this numeral is too large - move on to the next one */
                    ++ri;
                }
            }
        }
        else
        {
            t3sprintf(buf, sizeof(buf), "%ld", (long)i);
            format_int(vmg_ buf, strlen(buf), 0, opts, 0);
        }
    }

    /* format a floating-point value */
    void format_float(VMG_ const vm_val_t *val, char type_spec,
                      const fmtopts &opts)
    {
        /* a stack buffer for conversions that can use it */
        char buf[256];

        /* 
         *   Use the precision specified, with a default of 6 digits; assume
         *   that there's no maximum number of digits. 
         */
        int prec = (opts.prec >= 0 ? opts.prec : 6);
        int maxdigs = -1;

        /* figure the formatter flags */
        ulong flags = VMBN_FORMAT_LEADING_ZERO;

        /* if the sign option is set, always show a sign */
        if (opts.sign == '+')
            flags |= VMBN_FORMAT_SIGN;
        else if (opts.sign == ' ')
            flags |= VMBN_FORMAT_POS_SPACE;

        /* 
         *   if the '#' flag is set, always show a decimal point, and keep
         *   trailing zeros with 'g' and 'G' 
         */
        if (opts.pound)
        {
            flags |= VMBN_FORMAT_POINT;
            if (type_spec == 'g' || type_spec == 'G')
                flags |= VMBN_FORMAT_TRAILING_ZEROS;
        }

        /* for 'E' or 'G', use capital 'E' for the exponent indicator */
        if (type_spec == 'E' || type_spec == 'G')
            flags |= VMBN_FORMAT_EXP_CAP;

        /* 
         *   for 'e' or 'E', always use scientific notation, with a sign
         *   symbol in the exponent value 
         */
        if (type_spec == 'e' || type_spec == 'E')
            flags |= VMBN_FORMAT_EXP | VMBN_FORMAT_EXP_SIGN;

        /* if the type code is 'g' or 'G', use "compact" notation */
        if (type_spec == 'g' || type_spec == 'G')
        {
            /* set the compact notation flag */
            flags |= VMBN_FORMAT_COMPACT | VMBN_FORMAT_EXP_SIGN;

            /* the precision is the number of significant digits to show */
            flags |= VMBN_FORMAT_MAXSIG;
            maxdigs = prec;
            prec = -1;
        }

        /* cast the value to a numeric type */
        vm_val_t num;
        val->cast_to_num(vmg_ &num);
        G_stk->push(&num);

        /* check the type */
        switch (num.typ)
        {
        case VM_INT:
            {
                /* format the integer as though it were a float */
                const char *p = CVmObjBigNum::cvt_int_to_string_buf(
                    buf, sizeof(buf), num.val.intval,
                    maxdigs, -1, prec, 3, flags);
                
                /* write it out, adding padding and alignment */
                format_with_padding(vmg_ p, opts);
            }
            break;

        case VM_OBJ:
            /* if it's an object, it should be a BigNumber */
            if (CVmObjBigNum::is_bignum_obj(vmg_ num.val.obj))
            {
                /* get the BigNumber object */
                CVmObjBigNum *bn = (CVmObjBigNum *)vm_objp(vmg_ num.val.obj);

                /* format the BigNumber */
                vm_val_t str;
                const char *p = bn->cvt_to_string_buf(
                    vmg_ &str, buf, sizeof(buf),
                    maxdigs, -1, prec, 3, flags);
                G_stk->push(&str);

                /* write it out, adding padding and alignment */
                format_with_padding(vmg_ p, opts);

                /* discard gc protection */
                G_stk->discard();
            }
            break;

        default:
            break;
        }

        /* discard our gc protection */
        G_stk->discard();
    }

    /* result string */
    CVmObjString *str;

    /* current write pointer */
    char *dst;

    /* VM globals */
    vm_globals *vmg;
}